

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O1

size_t tool_header_cb(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  char *pcVar1;
  byte *pbVar2;
  char cVar3;
  long lVar4;
  undefined8 *puVar5;
  FILE *__s;
  bool bVar6;
  int iVar7;
  ushort **ppuVar8;
  char *pcVar9;
  undefined8 uVar10;
  size_t sVar11;
  char *pcVar12;
  size_t sVar13;
  char cVar14;
  byte *pbVar15;
  byte bVar16;
  byte *__src;
  ulong uVar17;
  size_t fnlen;
  char *local_80;
  size_t local_68;
  undefined8 local_38;
  
  uVar17 = nmemb * size;
  lVar4 = *(long *)(*(long *)((long)userdata + 8) + 0x18);
  sVar13 = (ulong)(uVar17 == 0);
  if (((lVar4 != 0) &&
      ((((puVar5 = *userdata, *(long *)(lVar4 + 0xb8) == 0 ||
         (__s = *(FILE **)(*(long *)((long)userdata + 8) + 0x10), __s == (FILE *)0x0)) ||
        (local_68 = fwrite(ptr,size,nmemb,__s), sVar13 = local_68, local_68 == uVar17)) &&
       ((sVar13 = uVar17, 0x14 < uVar17 && (*(char *)((long)userdata + 0x10) != '\0')))))) &&
     (iVar7 = Curl_raw_nequal("Content-disposition:",(char *)ptr,0x14), iVar7 != 0)) {
    pbVar2 = (byte *)((long)ptr + uVar17);
    bVar6 = false;
    __src = (byte *)((long)ptr + 0x14);
    do {
      bVar16 = *__src;
      if (__src < pbVar2 && bVar16 != 0) {
        ppuVar8 = __ctype_b_loc();
        do {
          pbVar15 = __src + 1;
          if (((*(byte *)((long)*ppuVar8 + (ulong)bVar16 * 2 + 1) & 4) != 0) ||
             (bVar16 = *pbVar15, __src = pbVar15, bVar16 == 0)) break;
        } while (pbVar15 < pbVar2);
      }
      iVar7 = 2;
      if (__src <= pbVar2 + -9) {
        if (__src[8] == 0x3d && *(long *)__src == 0x656d616e656c6966) {
          pcVar9 = strstr((char *)((long)ptr + 0x14),"filename*=");
          if (pcVar9 != (char *)0x0) {
            local_38 = 0;
            pcVar9 = strstr(pcVar9 + 10,"UTF-8\'\'");
            if (pcVar9 != (char *)0x0) {
              uVar10 = curl_easy_init();
              sVar11 = strlen(pcVar9 + 7);
              local_80 = (char *)curl_easy_unescape(uVar10,pcVar9 + 7,sVar11 & 0xffffffff,&local_38)
              ;
              curl_easy_cleanup(uVar10);
            }
            curl_mfprintf(_stderr,"STR=%s\n\n",local_80);
            bVar6 = true;
          }
          __src = __src + 9;
          if (!bVar6) {
            local_80 = (char *)malloc((long)ptr + (uVar17 - (long)__src) + 1);
            if (local_80 != (char *)0x0) {
              sVar11 = (long)ptr + (uVar17 - (long)__src);
              memcpy(local_80,__src,sVar11);
              local_80[sVar11] = '\0';
              cVar3 = *local_80;
              if ((cVar3 == '\'') || (pcVar9 = local_80, cVar14 = ';', cVar3 == '\"')) {
                pcVar9 = local_80 + 1;
                cVar14 = cVar3;
              }
              pcVar12 = strrchr(local_80,0x2f);
              if (pcVar12 == (char *)0x0) {
LAB_00107fec:
                pcVar12 = strrchr(pcVar9,0x5c);
                if (pcVar12 != (char *)0x0) {
                  if (pcVar12[1] == '\0') goto LAB_00108097;
                  pcVar9 = pcVar12 + 1;
                }
                cVar3 = *pcVar9;
                pcVar12 = pcVar9;
                while (cVar3 != '\0') {
                  if ((cVar3 == '\\') && (pcVar12[1] != '\0')) {
                    pcVar12 = pcVar12 + 1;
                  }
                  else if (cVar14 == cVar3) break;
                  pcVar1 = pcVar12 + 1;
                  pcVar12 = pcVar12 + 1;
                  cVar3 = *pcVar1;
                }
                *pcVar12 = '\0';
                pcVar12 = strchr(pcVar9,0xd);
                if (pcVar12 != (char *)0x0) {
                  *pcVar12 = '\0';
                }
                pcVar12 = strchr(pcVar9,10);
                if (pcVar12 != (char *)0x0) {
                  *pcVar12 = '\0';
                }
                if (local_80 != pcVar9) {
                  sVar11 = strlen(pcVar9);
                  memmove(local_80,pcVar9,sVar11 + 1);
                }
                goto LAB_001080ad;
              }
              if (pcVar12[1] != '\0') {
                pcVar9 = pcVar12 + 1;
                goto LAB_00107fec;
              }
LAB_00108097:
              free(local_80);
            }
            local_80 = (char *)0x0;
          }
LAB_001080ad:
          if (local_80 == (char *)0x0) {
            iVar7 = 1;
            local_80 = (char *)0x0;
            local_68 = (ulong)(uVar17 == 0);
          }
          else {
            *puVar5 = local_80;
            *(undefined4 *)(puVar5 + 1) = 0x10101;
            puVar5[2] = 0;
            *(undefined1 *)((long)userdata + 0x10) = 0;
          }
        }
        else {
          iVar7 = 3;
          for (; (__src < pbVar2 && (*__src != 0x3b)); __src = __src + 1) {
          }
        }
      }
    } while (iVar7 == 3);
    if (iVar7 != 2) {
      sVar13 = local_68;
    }
  }
  return sVar13;
}

Assistant:

size_t tool_header_cb(void *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct HdrCbData *hdrcbdata = userdata;
  struct OutStruct *outs = hdrcbdata->outs;
  struct OutStruct *heads = hdrcbdata->heads;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char*)ptr + cb;

  int encoded_file_name = FALSE;
  
  /*
   * Once that libcurl has called back tool_header_cb() the returned value
   * is checked against the amount that was intended to be written, if
   * it does not match then it fails with CURLE_WRITE_ERROR. So at this
   * point returning a value different from sz*nmemb indicates failure.
   */
  size_t failure = (size * nmemb) ? 0 : 1;

  if(!heads->config)
    return failure;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(heads->config, "Header data exceeds single call write limit!\n");
    return failure;
  }
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(heads->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
  }

  /*
   * This callback sets the filename where output shall be written when
   * curl options --remote-name (-O) and --remote-header-name (-J) have
   * been simultaneously given and additionally server returns an HTTP
   * Content-Disposition header specifying a filename property.
   */

  if(hdrcbdata->honor_cd_filename &&
     (cb > 20) && checkprefix("Content-disposition:", str)) {
    const char *p = str + 20;

    /* look for the 'filename=' parameter
       (encoded filenames (*=) are not supported) */
    for(;;) {
      char *filename;
      size_t len;
	  char* enc_ptr;	  

      while(*p && (p < end) && !ISALPHA(*p))
        p++;
      if(p > end - 9)
        break;

      if(memcmp(p, "filename=", 9)) {
        /* no match, find next parameter */
        while((p < end) && (*p != ';'))
          p++;
        continue;
      }
      p += 9;

	  enc_ptr = strstr(str + 20, "filename*=");
      if (enc_ptr) {
	  	char* fntmp = NULL;
		size_t fnlen = 0;
        enc_ptr += 10;

		fntmp = strstr(enc_ptr, "UTF-8''");
				
		if (fntmp != NULL) 
		{
			CURL* curl;
			curl = curl_easy_init();
			filename = curl_easy_unescape(curl,  fntmp + 7, strlen(fntmp + 7),&fnlen);
			curl_easy_cleanup(curl);
		}
        encoded_file_name = TRUE;

		//filename = strdup
		fprintf(stderr, "STR=%s\n\n", filename);
      }
	  
      /* this expression below typecasts 'cb' only to avoid
         warning: signed and unsigned type in conditional expression
      */
      len = (ssize_t)cb - (p - str);
	  if (encoded_file_name == FALSE)
		filename = parse_filename(p, len);

      if(filename) {
        outs->filename = filename;
        outs->alloc_filename = TRUE;
        outs->is_cd_filename = TRUE;
        outs->s_isreg = TRUE;
        outs->fopened = FALSE;
        outs->stream = NULL;
        hdrcbdata->honor_cd_filename = FALSE;
        break;
      }
      else
        return failure;
    }
  }

  return cb;
}